

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

void __thiscall
filtered_directed_graph_t::filtered_directed_graph_t
          (filtered_directed_graph_t *this,filtered_directed_graph_t *big_graph,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *subset)

{
  ulong uVar1;
  bool bVar2;
  reference puVar3;
  filtered_directed_graph_t *this_00;
  mapped_type *pmVar4;
  filtered_directed_graph_t *in_RDX;
  long in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_short,_unsigned_short>_&&>::value,_pair<iterator,_bool>_>
  _Var5;
  int b;
  size_t vertex_offset;
  size_t bits;
  size_t offset;
  unsigned_short v_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *__range1_1;
  unsigned_short v;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *__range1;
  vertex_index_t index;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  vertex_indices;
  undefined6 in_stack_fffffffffffffe78;
  vertex_index_t in_stack_fffffffffffffe7e;
  undefined6 in_stack_fffffffffffffe80;
  mapped_type in_stack_fffffffffffffe86;
  pair<unsigned_short,_unsigned_short> *in_stack_fffffffffffffe88;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 directed;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  _Node_iterator_base<unsigned_short,_false> local_110;
  short local_102;
  _Node_iterator_base<unsigned_short,_false> local_100;
  int local_f4;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  unsigned_short local_d2;
  _Node_iterator_base<unsigned_short,_false> local_d0;
  _Node_iterator_base<unsigned_short,_false> local_c8 [2];
  _Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false> local_b8;
  undefined1 local_b0;
  short local_a8;
  pair<unsigned_short,_unsigned_short> local_a6;
  unsigned_short local_a2;
  _Node_iterator_base<unsigned_short,_false> local_a0;
  _Node_iterator_base<unsigned_short,_false> local_98 [2];
  short local_82;
  undefined4 local_34;
  long local_10;
  
  directed = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  local_10 = in_RSI;
  std::
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  ::size((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *)0x145f83);
  local_34 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x145fa5);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (value_type_conflict2 *)in_stack_fffffffffffffe90,
             (allocator_type *)in_stack_fffffffffffffe88);
  filtered_directed_graph_t
            (in_RDX,(vector<float,_std::allocator<float>_> *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),(bool)directed);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90);
  std::allocator<float>::~allocator((allocator<float> *)0x146003);
  std::
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  ::unordered_map((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                   *)0x146010);
  local_82 = 0;
  local_98[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       ::begin((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       ::end((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
              *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
  while (bVar2 = std::__detail::operator!=(local_98,&local_a0), bVar2) {
    puVar3 = std::__detail::_Node_iterator<unsigned_short,_true,_false>::operator*
                       ((_Node_iterator<unsigned_short,_true,_false> *)0x14607c);
    local_a2 = *puVar3;
    local_a8 = local_82;
    local_82 = local_82 + 1;
    local_a6 = std::make_pair<unsigned_short&,unsigned_short>
                         ((unsigned_short *)
                          CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78),
                          (unsigned_short *)0x1460b9);
    _Var5 = std::
            unordered_map<unsigned_short,unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>>
            ::insert<std::pair<unsigned_short,unsigned_short>>
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_b8._M_cur =
         (__node_type *)
         _Var5.first.
         super__Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>._M_cur;
    local_b0 = _Var5.second;
    std::__detail::_Node_iterator<unsigned_short,_true,_false>::operator++
              ((_Node_iterator<unsigned_short,_true,_false> *)
               CONCAT26(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80));
  }
  local_c8[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       ::begin((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
       ::end((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
              *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
  while (bVar2 = std::__detail::operator!=(local_c8,&local_d0), bVar2) {
    puVar3 = std::__detail::_Node_iterator<unsigned_short,_true,_false>::operator*
                       ((_Node_iterator<unsigned_short,_true,_false> *)0x1461ef);
    local_d2 = *puVar3;
    for (local_e0 = 0; local_e0 < *(ulong *)(local_10 + 0xa0); local_e0 = local_e0 + 1) {
      local_e8 = directed_graph_t::get_outgoing_chunk
                           ((directed_graph_t *)
                            CONCAT26(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7e,0x146240);
      local_f0 = local_e0 << 6;
      while (local_e8 != 0) {
        local_f4 = 0;
        for (uVar1 = local_e8; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
          local_f4 = local_f4 + 1;
        }
        local_e8 = local_e8 & ~(1L << ((ulong)(byte)local_f4 & 0x3f));
        local_102 = (short)local_f0 + (short)local_f4;
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
             ::find((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78),
                    (key_type *)0x1462cf);
        local_110._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
             ::end((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
        bVar2 = std::__detail::operator!=(&local_100,&local_110);
        if (bVar2) {
          this_00 = (filtered_directed_graph_t *)
                    std::
                    unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                    ::operator[]((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                                  *)CONCAT26(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80),
                                 (key_type *)
                                 CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
          in_stack_fffffffffffffe86 = (this_00->super_directed_graph_t).number_of_vertices;
          pmVar4 = std::
                   unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                   ::operator[]((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                                 *)CONCAT26(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80),
                                (key_type *)
                                CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
          add_filtered_edge(this_00,(vertex_index_t)((ulong)pmVar4 >> 0x30),
                            (vertex_index_t)((ulong)pmVar4 >> 0x20),SUB84(pmVar4,0));
        }
      }
    }
    std::__detail::_Node_iterator<unsigned_short,_true,_false>::operator++
              ((_Node_iterator<unsigned_short,_true,_false> *)
               CONCAT26(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80));
  }
  std::
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  ::~unordered_map((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                    *)0x1463c3);
  return;
}

Assistant:

filtered_directed_graph_t(filtered_directed_graph_t* big_graph, std::unordered_set<vertex_index_t> subset)
	    : filtered_directed_graph_t(std::vector<value_t>(subset.size(), 0), big_graph->directed) {
		// Add the edges
		std::unordered_map<vertex_index_t, vertex_index_t> vertex_indices;
		vertex_index_t index = 0;
		for (auto v : subset) vertex_indices.insert(std::make_pair(v, index++));

		for (auto v : subset) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < big_graph->incidence_row_length; offset++) {
				auto bits = big_graph->get_outgoing_chunk(v, offset);
				size_t vertex_offset = offset << 6;

				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					if (subset.find(vertex_index_t(vertex_offset + b)) != subset.end())
						add_filtered_edge(vertex_indices[v], vertex_indices[vertex_index_t(vertex_offset + b)], 0);
				}
			}
		}
	}